

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenDataDropSetSegment(BinaryenExpressionRef expr,char *segment)

{
  Name local_28;
  
  if (expr->_id == DataDropId) {
    wasm::Name::Name(&local_28,segment);
    *(size_t *)(expr + 1) = local_28.super_IString.str._M_len;
    expr[1].type.id = (uintptr_t)local_28.super_IString.str._M_str;
    return;
  }
  __assert_fail("expression->is<DataDrop>()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xdbf,"void BinaryenDataDropSetSegment(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenDataDropSetSegment(BinaryenExpressionRef expr,
                                const char* segment) {
  auto* expression = (Expression*)expr;
  assert(expression->is<DataDrop>());
  static_cast<DataDrop*>(expression)->segment = Name(segment);
}